

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O2

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  __pid_t __pid;
  ssize_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_130;
  char buf;
  int fd [2];
  int status;
  
  iVar1 = pipe(fd);
  if (iVar1 != 0) {
    pcVar4 = "r == 0";
    uStack_130 = 0x3c;
    goto LAB_0013f922;
  }
  __pid = fork();
  close(fd[1]);
  if (__pid == 0) {
    sVar2 = read(fd[0],&buf,1);
    if (2 < (int)sVar2 + 1U) {
      pcVar4 = "-1 <= r && r <= 1";
      uStack_130 = 0x46;
      goto LAB_0013f922;
    }
    close(0);
    iVar1 = dup(fd[0]);
    if (iVar1 == -1) {
      pcVar4 = "r != -1";
      uStack_130 = 0x49;
      goto LAB_0013f922;
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar3,&status,0);
    if (iVar1 != 0) {
      pcVar4 = "r == 0";
      uStack_130 = 0x4d;
      goto LAB_0013f922;
    }
    iVar1 = uv_pipe_open(&status,0);
    if (iVar1 != 0) {
      pcVar4 = "r == 0";
      uStack_130 = 0x50;
      goto LAB_0013f922;
    }
    iVar1 = uv_read_start(&status,alloc_buffer,read_stdin);
    if (iVar1 != 0) {
      pcVar4 = "r == 0";
      uStack_130 = 0x53;
      goto LAB_0013f922;
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,2);
    if (iVar1 != 0) {
      pcVar4 = "uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0";
      uStack_130 = 0x5a;
      goto LAB_0013f922;
    }
  }
  else {
    close(fd[0]);
    waitpid(__pid,&status,0);
    if (((ushort)status & 0xff7f) != 0) {
      pcVar4 = "WIFEXITED(status) && WEXITSTATUS(status) == 0";
      uStack_130 = 0x65;
      goto LAB_0013f922;
    }
  }
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
  uStack_130 = 0x68;
LAB_0013f922:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
          ,uStack_130,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT(r == 0);

  if ((pid = fork()) == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT(r != -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT(r == 0);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT(uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0);
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}